

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O0

StatusOr<unsigned_long> __thiscall
google::protobuf::json_internal::JsonLexer::ParseUnicodeEscape(JsonLexer *this,char *out_utf8)

{
  bool bVar1;
  Status *pSVar2;
  unsigned_short *puVar3;
  byte *in_RDX;
  anon_union_8_2_a3c22f61_for_StatusOrData<unsigned_long>_3 extraout_RDX;
  StatusOr<unsigned_long> SVar4;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  undefined1 local_e8 [40];
  pointer local_c0;
  undefined1 local_b8 [44];
  uint local_8c;
  uint32_t low;
  Status _status_2;
  StatusOr<unsigned_short> hex_1;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined1 local_58 [8];
  Status _status_1;
  uint32_t high;
  uint32_t rune;
  Status local_38;
  Status _status;
  StatusOr<unsigned_short> hex;
  char *out_utf8_local;
  JsonLexer *this_local;
  
  ParseU16HexCodepoint((JsonLexer *)&_status);
  pSVar2 = absl::lts_20240722::StatusOr<unsigned_short>::status
                     ((StatusOr<unsigned_short> *)&_status);
  absl::lts_20240722::Status::Status(&local_38,pSVar2);
  bVar1 = absl::lts_20240722::Status::ok(&local_38);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    absl::lts_20240722::StatusOr<unsigned_long>::StatusOr<const_absl::lts_20240722::Status,_0>
              ((StatusOr<unsigned_long> *)this,&local_38);
  }
  absl::lts_20240722::Status::~Status(&local_38);
  if (bVar1) goto LAB_004a6917;
  puVar3 = absl::lts_20240722::StatusOr<unsigned_short>::operator*
                     ((StatusOr<unsigned_short> *)&_status);
  _status_1.rep_._4_4_ = (uint)*puVar3;
  if ((_status_1.rep_._4_4_ < 0xd800) || (0xdbff < _status_1.rep_._4_4_)) {
    if ((0xdbff < _status_1.rep_._4_4_) && (_status_1.rep_._4_4_ < 0xe000)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)(local_e8 + 0x20),
                 "unpaired low surrogate");
      JsonLocation::SourceLocation::current();
      Invalid((JsonLexer *)local_b8,out_utf8,local_e8._32_8_,local_c0);
      absl::lts_20240722::StatusOr<unsigned_long>::StatusOr<absl::lts_20240722::Status,_0>
                ((StatusOr<unsigned_long> *)this,(Status *)local_b8);
      absl::lts_20240722::Status::~Status((Status *)local_b8);
      goto LAB_004a6917;
    }
  }
  else {
    _status_1.rep_._0_4_ = _status_1.rep_._4_4_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"\\u");
    JsonLocation::SourceLocation::current();
    Expect((JsonLexer *)local_58,out_utf8,local_68._M_len,local_68._M_str);
    bVar1 = absl::lts_20240722::Status::ok((Status *)local_58);
    bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
    if (bVar1) {
      absl::lts_20240722::StatusOr<unsigned_long>::StatusOr<const_absl::lts_20240722::Status,_0>
                ((StatusOr<unsigned_long> *)this,(Status *)local_58);
    }
    absl::lts_20240722::Status::~Status((Status *)local_58);
    if (bVar1) goto LAB_004a6917;
    ParseU16HexCodepoint((JsonLexer *)&_status_2);
    pSVar2 = absl::lts_20240722::StatusOr<unsigned_short>::status
                       ((StatusOr<unsigned_short> *)&_status_2);
    absl::lts_20240722::Status::Status((Status *)&stack0xffffffffffffff78,pSVar2);
    bVar1 = absl::lts_20240722::Status::ok((Status *)&stack0xffffffffffffff78);
    bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
    if (bVar1) {
      absl::lts_20240722::StatusOr<unsigned_long>::StatusOr<const_absl::lts_20240722::Status,_0>
                ((StatusOr<unsigned_long> *)this,(Status *)&stack0xffffffffffffff78);
    }
    absl::lts_20240722::Status::~Status((Status *)&stack0xffffffffffffff78);
    if (!bVar1) {
      puVar3 = absl::lts_20240722::StatusOr<unsigned_short>::operator*
                         ((StatusOr<unsigned_short> *)&_status_2);
      local_8c = (uint)*puVar3;
      if ((local_8c < 0xdc00) || (0xdfff < local_8c)) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)(local_b8 + 0x10),
                   "invalid low surrogate");
        JsonLocation::SourceLocation::current();
        Invalid((JsonLexer *)(local_b8 + 0x20),out_utf8,local_b8._16_8_,local_b8._24_8_);
        absl::lts_20240722::StatusOr<unsigned_long>::StatusOr<absl::lts_20240722::Status,_0>
                  ((StatusOr<unsigned_long> *)this,(Status *)(local_b8 + 0x20));
        absl::lts_20240722::Status::~Status((Status *)(local_b8 + 0x20));
        bVar1 = true;
      }
      else {
        _status_1.rep_._4_4_ = (local_8c & 0x3ff | ((uint)_status_1.rep_ & 0x3ff) << 10) + 0x10000;
        bVar1 = false;
      }
    }
    absl::lts_20240722::StatusOr<unsigned_short>::~StatusOr((StatusOr<unsigned_short> *)&_status_2);
    if (bVar1) goto LAB_004a6917;
  }
  if (_status_1.rep_._4_4_ < 0x80) {
    *in_RDX = _status_1.rep_._4_1_;
    local_e8._24_4_ = 1;
    absl::lts_20240722::StatusOr<unsigned_long>::StatusOr<int,_0>
              ((StatusOr<unsigned_long> *)this,(int *)(local_e8 + 0x18));
  }
  else if (_status_1.rep_._4_4_ < 0x800) {
    *in_RDX = (byte)(_status_1.rep_._4_4_ >> 6) & 0x1f | 0xc0;
    in_RDX[1] = _status_1.rep_._4_1_ & 0x3f | 0x80;
    local_e8._20_4_ = 2;
    absl::lts_20240722::StatusOr<unsigned_long>::StatusOr<int,_0>
              ((StatusOr<unsigned_long> *)this,(int *)(local_e8 + 0x14));
  }
  else if (_status_1.rep_._4_4_ < 0x10000) {
    *in_RDX = (byte)(_status_1.rep_._4_4_ >> 0xc) & 0xf | 0xe0;
    in_RDX[1] = (byte)(_status_1.rep_._4_4_ >> 6) & 0x3f | 0x80;
    in_RDX[2] = _status_1.rep_._4_1_ & 0x3f | 0x80;
    local_e8._16_4_ = 3;
    absl::lts_20240722::StatusOr<unsigned_long>::StatusOr<int,_0>
              ((StatusOr<unsigned_long> *)this,(int *)(local_e8 + 0x10));
  }
  else if (_status_1.rep_._4_4_ < 0x110000) {
    *in_RDX = (byte)(_status_1.rep_._4_4_ >> 0x12) & 7 | 0xf0;
    in_RDX[1] = (byte)(_status_1.rep_._4_4_ >> 0xc) & 0x3f | 0x80;
    in_RDX[2] = (byte)(_status_1.rep_._4_4_ >> 6) & 0x3f | 0x80;
    in_RDX[3] = _status_1.rep_._4_1_ & 0x3f | 0x80;
    local_e8._12_4_ = 4;
    absl::lts_20240722::StatusOr<unsigned_long>::StatusOr<int,_0>
              ((StatusOr<unsigned_long> *)this,(int *)(local_e8 + 0xc));
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_f8,"invalid codepoint");
    JsonLocation::SourceLocation::current();
    Invalid((JsonLexer *)local_e8,out_utf8,local_f8._M_len,local_f8._M_str);
    absl::lts_20240722::StatusOr<unsigned_long>::StatusOr<absl::lts_20240722::Status,_0>
              ((StatusOr<unsigned_long> *)this,(Status *)local_e8);
    absl::lts_20240722::Status::~Status((Status *)local_e8);
  }
LAB_004a6917:
  absl::lts_20240722::StatusOr<unsigned_short>::~StatusOr((StatusOr<unsigned_short> *)&_status);
  SVar4.super_StatusOrData<unsigned_long>.field_1.data_ = extraout_RDX.data_;
  SVar4.super_StatusOrData<unsigned_long>.field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<unsigned_long>_1)this;
  return (StatusOr<unsigned_long>)SVar4.super_StatusOrData<unsigned_long>;
}

Assistant:

absl::StatusOr<size_t> JsonLexer::ParseUnicodeEscape(char out_utf8[4]) {
  auto hex = ParseU16HexCodepoint();
  RETURN_IF_ERROR(hex.status());

  uint32_t rune = *hex;
  if (rune >= 0xd800 && rune <= 0xdbff) {
    // Surrogate pair: two 16-bit codepoints become a 32-bit codepoint.
    uint32_t high = rune;

    RETURN_IF_ERROR(Expect("\\u"));
    auto hex = ParseU16HexCodepoint();
    RETURN_IF_ERROR(hex.status());

    uint32_t low = *hex;
    if (low < 0xdc00 || low > 0xdfff) {
      return Invalid("invalid low surrogate");
    }

    rune = (high & 0x3ff) << 10;
    rune |= (low & 0x3ff);
    rune += 0x10000;
  } else if (rune >= 0xdc00 && rune <= 0xdfff) {
    return Invalid("unpaired low surrogate");
  }

  // Write as UTF-8.
  if (rune <= 0x7f) {
    out_utf8[0] = rune;
    return 1;
  } else if (rune <= 0x07ff) {
    out_utf8[0] = ((rune >> 6) & 0x1f) | 0xc0;
    out_utf8[1] = ((rune >> 0) & 0x3f) | 0x80;
    return 2;
  } else if (rune <= 0xffff) {
    out_utf8[0] = ((rune >> 12) & 0x0f) | 0xe0;
    out_utf8[1] = ((rune >> 6) & 0x3f) | 0x80;
    out_utf8[2] = ((rune >> 0) & 0x3f) | 0x80;
    return 3;
  } else if (rune <= 0x10ffff) {
    out_utf8[0] = ((rune >> 18) & 0x07) | 0xF0;
    out_utf8[1] = ((rune >> 12) & 0x3f) | 0x80;
    out_utf8[2] = ((rune >> 6) & 0x3f) | 0x80;
    out_utf8[3] = ((rune >> 0) & 0x3f) | 0x80;
    return 4;
  } else {
    return Invalid("invalid codepoint");
  }
}